

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O0

string * ApprovalTests::HelpMessages::topAndTailHelpMessage(string *message)

{
  string *in_RDI;
  string lineBuffer;
  string lineBreak;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [39];
  undefined1 local_69 [56];
  undefined1 local_31 [49];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
  psVar1 = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_31 + 1),
             "*****************************************************************************",
             (allocator *)__lhs);
  ::std::allocator<char>::~allocator((allocator<char> *)local_31);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_69 + 1),
             "*                                                                           *\n",
             (allocator *)__rhs);
  ::std::allocator<char>::~allocator((allocator<char> *)local_69);
  ::std::operator+(__lhs,(char)((ulong)psVar1 >> 0x38));
  ::std::operator+(in_RDI,__rhs);
  ::std::operator+(in_RDI,__rhs);
  ::std::operator+(in_RDI,__rhs);
  ::std::operator+(in_RDI,__rhs);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_b0);
  ::std::__cxx11::string::~string(local_d0);
  ::std::__cxx11::string::~string(local_f0);
  ::std::__cxx11::string::~string((string *)(local_69 + 1));
  ::std::__cxx11::string::~string((string *)(local_31 + 1));
  return psVar1;
}

Assistant:

std::string HelpMessages::topAndTailHelpMessage(const std::string& message)
    {
        const std::string lineBreak =
            "**************************************************************"
            "***************";
        const std::string lineBuffer =
            "*                                                             "
            "              *\n";
        return lineBreak + '\n' + lineBuffer + message + lineBuffer + lineBreak;
    }